

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_aec.c
# Opt level: O3

int update_state(test_state *state)

{
  uint uVar1;
  uint uVar2;
  aec_stream *paVar3;
  ulong uVar4;
  undefined8 uVar5;
  ulong uVar6;
  code *pcVar7;
  
  paVar3 = state->strm;
  uVar1 = paVar3->bits_per_sample;
  if (uVar1 < 0x11) {
    if (uVar1 < 9) {
      uVar5 = 0x100000003;
    }
    else {
      uVar5 = 0x200000004;
    }
    state->id_len = (int)uVar5;
    state->bytes_per_sample = (int)((ulong)uVar5 >> 0x20);
  }
  else {
    state->id_len = 5;
    if ((uVar1 < 0x19) && ((paVar3->flags & 2) != 0)) {
      state->bytes_per_sample = 3;
    }
    else {
      state->bytes_per_sample = 4;
    }
  }
  uVar2 = paVar3->flags;
  pcVar7 = out_msb;
  if ((uVar2 & 4) == 0) {
    pcVar7 = out_lsb;
  }
  uVar6 = -1L << ((byte)uVar1 - 1 & 0x3f);
  state->out = pcVar7;
  uVar4 = uVar6;
  if ((uVar2 & 1) == 0) {
    uVar6 = -1L << ((byte)uVar1 & 0x3f);
    uVar4 = 0;
  }
  state->xmin = uVar4;
  state->xmax = ~uVar6;
  return 0;
}

Assistant:

int update_state(struct test_state *state)
{
    struct aec_stream *strm = state->strm;

    if (strm->bits_per_sample > 16) {
        state->id_len = 5;

        if (strm->bits_per_sample <= 24 && strm->flags & AEC_DATA_3BYTE) {
            state->bytes_per_sample = 3;
        } else {
            state->bytes_per_sample = 4;
        }
    }
    else if (strm->bits_per_sample > 8) {
        state->id_len = 4;
        state->bytes_per_sample = 2;
    } else {
        state->id_len = 3;
        state->bytes_per_sample = 1;
    }

    if (strm->flags & AEC_DATA_MSB)
        state->out = out_msb;
    else
        state->out = out_lsb;

    if (strm->flags & AEC_DATA_SIGNED) {
        state->xmin = -(1LL << (strm->bits_per_sample - 1));
        state->xmax = (1ULL << (strm->bits_per_sample - 1)) - 1;
    } else {
        state->xmin = 0;
        state->xmax = (1ULL << strm->bits_per_sample) - 1;
    }

    return 0;
}